

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::params_to_query_str(string *__return_storage_ptr__,Params *params)

{
  _Base_ptr p_Var1;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (p_Var1 = (params->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(params->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1 != (params->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    encode_query_param(&local_50,(string *)(p_Var1 + 2));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string params_to_query_str(const Params& params) {
            std::string query;

            for (auto it = params.begin(); it != params.end(); ++it) {
                if (it != params.begin()) { query += "&"; }
                query += it->first;
                query += "=";
                query += encode_query_param(it->second);
            }
            return query;
        }